

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_rawsetp(lua_State *L,int idx,void *p)

{
  ushort uVar1;
  int iVar2;
  GCObject *pGVar3;
  int *piVar4;
  TValue *pTVar5;
  TValue *pTVar6;
  StkId pTVar7;
  TValue k;
  Value local_28;
  undefined2 local_20;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x48c,"void lua_rawsetp(lua_State *, int, const void *)");
  }
  if ((long)L->top - (long)L->ci->func < 0x11) {
    __assert_fail("((1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x48d,"void lua_rawsetp(lua_State *, int, const void *)");
  }
  pTVar5 = index2addr(L,idx);
  if (pTVar5->tt_ != 0x8005) {
    __assert_fail("(((((o))->tt_) == (((5) | (1 << 15))))) && \"table expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x48f,"void lua_rawsetp(lua_State *, int, const void *)");
  }
  local_20 = 2;
  local_28.p = p;
  if (((Table *)(pTVar5->value_).gc)->tt == '\x05') {
    pTVar6 = luaH_set(L,(Table *)(pTVar5->value_).gc,(TValue *)&local_28);
    pTVar7 = L->top;
    pGVar3 = pTVar7[-1].value_.gc;
    (pTVar6->value_).gc = pGVar3;
    uVar1 = pTVar7[-1].tt_;
    pTVar6->tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
        ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x492,"void lua_rawsetp(lua_State *, int, const void *)");
    }
    pTVar7 = L->top;
    if ((short)pTVar7[-1].tt_ < 0) {
      if (-1 < (short)pTVar5->tt_) {
        __assert_fail("(((o)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x493,"void lua_rawsetp(lua_State *, int, const void *)");
      }
      if (((((pTVar5->value_).gc)->marked & 0x20) != 0) &&
         (((pTVar7[-1].value_.gc)->marked & 0x18) != 0)) {
        luaC_barrierback_(L,(pTVar5->value_).gc);
        pTVar7 = L->top;
      }
    }
    L->top = pTVar7 + -1;
    piVar4 = *(int **)&L[-1].hookmask;
    *piVar4 = *piVar4 + -1;
    if (*piVar4 == 0) {
      return;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x495,"void lua_rawsetp(lua_State *, int, const void *)");
  }
  __assert_fail("(((o)->value_).gc)->tt == 5",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x491,"void lua_rawsetp(lua_State *, int, const void *)");
}

Assistant:

LUA_API void lua_rawsetp (lua_State *L, int idx, const void *p) {
  StkId o;
  TValue k, *slot;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2addr(L, idx);
  api_check(L, ttisLtable(o), "table expected");
  setpvalue(&k, cast(void *, p));
  slot = luaH_set(L, hvalue(o), &k);
  setobj2t(L, slot, L->top - 1);
  luaC_barrierback(L, gcvalue(o), L->top - 1);
  L->top--;
  lua_unlock(L);
}